

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O1

bool __thiscall
slang::driver::Driver::processCommandFiles
          (Driver *this,string_view pattern,bool makeRelative,bool separateUnit)

{
  flat_hash_set<std::filesystem::path> *arrays_;
  size_t *psVar1;
  long lVar2;
  byte bVar3;
  byte bVar4;
  group_type_pointer pgVar5;
  value_type_pointer ppVar6;
  ulong uVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  size_t sVar11;
  slot_type *psVar12;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var13;
  _List _Var14;
  group_type_pointer pgVar15;
  path *ppVar16;
  value_type_pointer ppVar17;
  bool bVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  path *ppVar23;
  path *message;
  ulong uVar24;
  size_type *p;
  undefined7 in_register_00000081;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar25;
  path *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 path;
  value_type_pointer ppVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  uchar uVar37;
  uchar uVar38;
  uchar uVar39;
  uchar uVar40;
  uchar uVar41;
  uchar uVar42;
  uchar uVar43;
  uchar uVar44;
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view pattern_00;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  error_code eVar45;
  string_view text;
  string_view argList;
  path currPath;
  error_code ec;
  SmallVector<char,_40UL> buffer;
  error_code globEc;
  SmallVector<std::filesystem::__cxx11::path,_2UL> files;
  Driver *pDVar46;
  bool local_1e8;
  uint local_1e4;
  undefined1 local_1c8 [32];
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> local_1a8;
  path *local_1a0;
  ulong local_198;
  ulong local_190;
  group_type_pointer local_188;
  undefined4 local_17c;
  path local_178;
  path *local_148;
  value_type_pointer local_140;
  error_code local_138;
  size_type local_128 [2];
  undefined1 local_118 [24];
  char acStack_100 [40];
  uchar local_d8;
  uchar uStack_d7;
  uchar uStack_d6;
  uchar uStack_d5;
  uchar uStack_d4;
  uchar uStack_d3;
  uchar uStack_d2;
  uchar uStack_d1;
  uchar uStack_d0;
  uchar uStack_cf;
  uchar uStack_ce;
  uchar uStack_cd;
  uchar uStack_cc;
  uchar uStack_cb;
  uchar uStack_ca;
  uchar uStack_c9;
  ulong local_c0;
  path *local_b8;
  error_category *local_b0;
  int local_a8 [2];
  error_category *local_a0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_98;
  long local_90;
  undefined8 local_88;
  undefined1 local_80 [80];
  
  pattern_00._M_len = pattern._M_str;
  ppVar23 = (path *)pattern._M_len;
  local_17c = (undefined4)CONCAT71(in_register_00000081,separateUnit);
  local_98.values_ = (value<fmt::v11::context> *)local_80;
  local_90 = 0;
  local_88 = 2;
  local_a8[0] = 0;
  local_b0 = (error_category *)std::_V2::system_category();
  this_00 = (path *)local_118;
  local_a0 = local_b0;
  std::filesystem::__cxx11::path::path(this_00);
  aVar25.values_ = (value<fmt::v11::context> *)0x0;
  pattern_00._M_str = (char *)0x0;
  message = ppVar23;
  svGlob((slang *)this_00,ppVar23,pattern_00,(GlobMode)&local_98,
         (SmallVector<std::filesystem::__cxx11::path,_2UL> *)0x0,SUB81(local_a8,0),
         (error_code *)this);
  std::filesystem::__cxx11::path::~path((path *)local_118);
  if (local_a8[0] == 0) {
    local_1e8 = local_90 == 0;
    if (!local_1e8) {
      local_b8 = (path *)(local_90 * 0x28 + (long)local_98.values_);
      arrays_ = &this->activeCommandFiles;
      path = local_98;
      pDVar46 = this;
      do {
        local_118._0_8_ = acStack_100;
        local_118._8_8_ = (path *)0x0;
        local_118._16_8_ = (undefined1 *)0x28;
        eVar45 = OS::readFile((path *)path.values_,(SmallVector<char,_40UL> *)local_118);
        if (eVar45._M_value != 0) {
          (**(code **)(*(long *)eVar45._M_cat + 0x20))(&local_138,eVar45._M_cat,eVar45._M_value);
          local_1c8._0_8_ = ((path.values_)->field_0).long_long_value;
          local_1c8._8_8_ = ((path.values_)->field_0).string.size;
          local_1c8._16_8_ = CONCAT44(local_138._4_4_,local_138._M_value);
          local_1c8._24_8_ = local_138._M_cat;
          args_01.field_1.args_ = aVar25.args_;
          args_01.desc_ = (unsigned_long_long)local_1c8;
          fmt_01.size_ = 0xdd;
          fmt_01.data_ = (char *)0x15;
          ::fmt::v11::vformat_abi_cxx11_
                    (&local_178._M_pathname,(v11 *)"command file \'{}\': {}",fmt_01,args_01);
          message = &local_178;
          printError(this,&message->_M_pathname);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_pathname._M_dataplus._M_p != &local_178._M_pathname.field_2) {
            message = (path *)(local_178._M_pathname.field_2._M_allocated_capacity + 1);
            operator_delete(local_178._M_pathname._M_dataplus._M_p,(size_t)message);
          }
          p = (size_type *)CONCAT44(local_138._4_4_,local_138._M_value);
          if ((size_type *)CONCAT44(local_138._4_4_,local_138._M_value) != local_128) {
LAB_0025fc95:
            message = (path *)(local_128[0] + 1);
            operator_delete(p,(size_t)message);
          }
LAB_0025fc9d:
          this->anyFailedLoads = true;
LAB_0025fcb9:
          if ((char *)local_118._0_8_ != acStack_100) {
            operator_delete((void *)local_118._0_8_);
          }
          break;
        }
        local_148 = this_00;
        uVar20 = std::filesystem::__cxx11::hash_value((path *)path.values_);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = uVar20;
        uVar22 = SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),0);
        uVar24 = uVar22 >> ((byte)(arrays_->table_).
                                  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                                  .arrays.groups_size_index & 0x3f);
        lVar2 = (uVar22 & 0xff) * 4;
        uVar29 = (&UNK_0051605c)[lVar2];
        uVar30 = (&UNK_0051605d)[lVar2];
        uVar31 = (&UNK_0051605e)[lVar2];
        uVar32 = (&UNK_0051605f)[lVar2];
        local_1a0 = (path *)(ulong)((uint)uVar22 & 7);
        uVar20 = 0;
        uVar33 = uVar29;
        uVar34 = uVar30;
        uVar35 = uVar31;
        uVar36 = uVar32;
        uVar37 = uVar29;
        uVar38 = uVar30;
        uVar39 = uVar31;
        uVar40 = uVar32;
        uVar41 = uVar29;
        uVar42 = uVar30;
        uVar43 = uVar31;
        uVar44 = uVar32;
        local_190 = uVar24;
        do {
          pgVar5 = (this->activeCommandFiles).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                   .arrays.groups_;
          pgVar15 = pgVar5 + uVar24;
          auVar27[0] = -(pgVar15->m[0].n == uVar29);
          auVar27[1] = -(pgVar15->m[1].n == uVar30);
          auVar27[2] = -(pgVar15->m[2].n == uVar31);
          auVar27[3] = -(pgVar15->m[3].n == uVar32);
          auVar27[4] = -(pgVar15->m[4].n == uVar33);
          auVar27[5] = -(pgVar15->m[5].n == uVar34);
          auVar27[6] = -(pgVar15->m[6].n == uVar35);
          auVar27[7] = -(pgVar15->m[7].n == uVar36);
          auVar27[8] = -(pgVar15->m[8].n == uVar37);
          auVar27[9] = -(pgVar15->m[9].n == uVar38);
          auVar27[10] = -(pgVar15->m[10].n == uVar39);
          auVar27[0xb] = -(pgVar15->m[0xb].n == uVar40);
          auVar27[0xc] = -(pgVar15->m[0xc].n == uVar41);
          auVar27[0xd] = -(pgVar15->m[0xd].n == uVar42);
          auVar27[0xe] = -(pgVar15->m[0xe].n == uVar43);
          auVar27[0xf] = -(pgVar15->m[0xf].n == uVar44);
          uVar21 = (uint)(ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe);
          local_198 = uVar20;
          local_c0 = uVar24;
          if (uVar21 != 0) {
            ppVar6 = (this->activeCommandFiles).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                     .arrays.elements_;
            this = pDVar46;
            local_d8 = uVar29;
            uStack_d7 = uVar30;
            uStack_d6 = uVar31;
            uStack_d5 = uVar32;
            uStack_d4 = uVar33;
            uStack_d3 = uVar34;
            uStack_d2 = uVar35;
            uStack_d1 = uVar36;
            uStack_d0 = uVar37;
            uStack_cf = uVar38;
            uStack_ce = uVar39;
            uStack_cd = uVar40;
            uStack_cc = uVar41;
            uStack_cb = uVar42;
            uStack_ca = uVar43;
            uStack_c9 = uVar44;
            do {
              uVar8 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                }
              }
              ppVar26 = ppVar6 + uVar24 * 0xf + (ulong)uVar8;
              iVar19 = std::filesystem::__cxx11::path::compare((path *)path.values_);
              ppVar17 = ppVar26;
              if (iVar19 == 0) goto LAB_0025f80c;
              uVar21 = uVar21 - 1 & uVar21;
              uVar29 = local_d8;
              uVar30 = uStack_d7;
              uVar31 = uStack_d6;
              uVar32 = uStack_d5;
              uVar33 = uStack_d4;
              uVar34 = uStack_d3;
              uVar35 = uStack_d2;
              uVar36 = uStack_d1;
              uVar37 = uStack_d0;
              uVar38 = uStack_cf;
              uVar39 = uStack_ce;
              uVar40 = uStack_cd;
              uVar41 = uStack_cc;
              uVar42 = uStack_cb;
              uVar43 = uStack_ca;
              uVar44 = uStack_c9;
              pDVar46 = this;
            } while (uVar21 != 0);
          }
          this = pDVar46;
          ppVar17 = local_140;
          if ((pgVar5[uVar24].m[0xf].n & local_1a0[0x208e8]._M_pathname.field_2._M_local_buf[0]) ==
              0) {
            ppVar26 = (value_type_pointer)0x0;
            goto LAB_0025f80c;
          }
          uVar7 = (this->activeCommandFiles).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                  .arrays.groups_size_mask;
          uVar20 = local_198 + 1;
          uVar24 = local_c0 + local_198 + 1 & uVar7;
          pDVar46 = this;
        } while (uVar20 <= uVar7);
        ppVar26 = (value_type_pointer)0x0;
LAB_0025f80c:
        local_140 = ppVar17;
        if (ppVar26 != (value_type_pointer)0x0) {
          local_178._M_pathname._M_dataplus._M_p =
               (pointer)((path.values_)->field_0).long_long_value;
          local_178._M_pathname._M_string_length = ((path.values_)->field_0).string.size;
          args_00.field_1.args_ = aVar25.args_;
          args_00.desc_ = (unsigned_long_long)&local_178;
          fmt_00.size_ = 0xd;
          fmt_00.data_ = (char *)0x2d;
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)local_1c8,(v11 *)"command file \'{}\' includes itself recursively",
                     fmt_00,args_00);
          message = (path *)local_1c8;
          printError(this,(string *)message);
          local_128[0] = local_1c8._16_8_;
          p = (size_type *)local_1c8._0_8_;
          if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) goto LAB_0025fc95;
          goto LAB_0025fc9d;
        }
        pDVar46 = this;
        if ((this->activeCommandFiles).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
            .size_ctrl.size <
            (this->activeCommandFiles).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
            .size_ctrl.ml) {
          aVar25 = path;
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::filesystem::__cxx11::path,void>,std::equal_to<std::filesystem::__cxx11::path>,std::allocator<std::filesystem::__cxx11::path>>
          ::nosize_unchecked_emplace_at<std::filesystem::__cxx11::path_const&>
                    ((locator *)local_1c8,
                     (table_core<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::filesystem::__cxx11::path,void>,std::equal_to<std::filesystem::__cxx11::path>,std::allocator<std::filesystem::__cxx11::path>>
                      *)arrays_,(arrays_type *)arrays_,local_190,uVar22,(path *)path.values_);
          psVar1 = &(this->activeCommandFiles).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                    .size_ctrl.size;
          *psVar1 = *psVar1 + 1;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::filesystem::__cxx11::path,void>,std::equal_to<std::filesystem::__cxx11::path>,std::allocator<std::filesystem::__cxx11::path>>
          ::unchecked_emplace_with_rehash<std::filesystem::__cxx11::path_const&>
                    ((locator *)local_1c8,
                     (table_core<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::filesystem::__cxx11::path,void>,std::equal_to<std::filesystem::__cxx11::path>,std::allocator<std::filesystem::__cxx11::path>>
                      *)arrays_,uVar22,(path *)path.values_);
        }
        std::filesystem::__cxx11::path::path((path *)local_1c8);
        local_138._M_value = 0;
        local_138._M_cat = local_b0;
        if (makeRelative) {
          std::filesystem::current_path_abi_cxx11_((error_code *)&local_178);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                     &local_178._M_pathname);
          _Var14._M_impl._M_t.
          super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          ._M_t.
          super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl
               = local_178._M_cmpts._M_impl._M_t.
                 super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                 .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                 _M_head_impl;
          _Var13._M_head_impl = local_1a8._M_head_impl;
          local_178._M_cmpts._M_impl._M_t.
          super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          ._M_t.
          super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl
               = (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                  )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
                    )0x0;
          local_1a8._M_head_impl =
               (_Impl *)_Var14._M_impl._M_t.
                        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        .
                        super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                        ._M_head_impl;
          if ((__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
               )_Var13._M_head_impl !=
              (tuple<std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
               )0x0) {
            std::filesystem::__cxx11::path::_List::_Impl_deleter::operator()
                      ((_Impl_deleter *)&local_1a8,_Var13._M_head_impl);
          }
          std::filesystem::__cxx11::path::clear(&local_178);
          std::filesystem::__cxx11::path::~path(&local_178);
          std::filesystem::__cxx11::path::parent_path();
          std::filesystem::current_path(&local_178,&local_138);
          std::filesystem::__cxx11::path::~path(&local_178);
        }
        text._M_len = (path *)((long)&(((path *)(local_118._8_8_ + -0x28))->_M_cmpts)._M_impl._M_t.
                                      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                      .
                                      super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                              + 7);
        local_118._8_8_ = text._M_len;
        if ((char)local_17c == '\0') {
          argList._M_str = (char *)local_118._0_8_;
          argList._M_len = (size_t)text._M_len;
          bVar18 = parseCommandLine(this,argList,(ParseOptions)0x1010101);
        }
        else {
          text._M_str = (char *)local_118._0_8_;
          bVar18 = parseUnitListing(this,text);
        }
        if (makeRelative) {
          std::filesystem::current_path((path *)local_1c8,&local_138);
        }
        uVar20 = std::filesystem::__cxx11::hash_value((path *)path.values_);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = uVar20;
        uVar22 = SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),0);
        lVar2 = (uVar22 & 0xff) * 4;
        uVar29 = (&UNK_0051605c)[lVar2];
        uVar30 = (&UNK_0051605d)[lVar2];
        uVar31 = (&UNK_0051605e)[lVar2];
        uVar32 = (&UNK_0051605f)[lVar2];
        local_198 = (ulong)((uint)uVar22 & 7);
        uVar20 = 0;
        local_140 = (value_type_pointer)0x0;
        ppVar23 = (path *)(uVar22 >>
                          ((byte)(arrays_->table_).
                                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                                 .arrays.groups_size_index & 0x3f));
        uVar33 = uVar29;
        uVar34 = uVar30;
        uVar35 = uVar31;
        uVar36 = uVar32;
        uVar37 = uVar29;
        uVar38 = uVar30;
        uVar39 = uVar31;
        uVar40 = uVar32;
        uVar41 = uVar29;
        uVar42 = uVar30;
        uVar43 = uVar31;
        uVar44 = uVar32;
        do {
          pgVar5 = (this->activeCommandFiles).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                   .arrays.groups_;
          pgVar15 = pgVar5 + (long)ppVar23;
          pgVar5 = pgVar5 + (long)ppVar23;
          auVar28[0] = -(pgVar5->m[0].n == uVar29);
          auVar28[1] = -(pgVar5->m[1].n == uVar30);
          auVar28[2] = -(pgVar5->m[2].n == uVar31);
          auVar28[3] = -(pgVar5->m[3].n == uVar32);
          auVar28[4] = -(pgVar5->m[4].n == uVar33);
          auVar28[5] = -(pgVar5->m[5].n == uVar34);
          auVar28[6] = -(pgVar5->m[6].n == uVar35);
          auVar28[7] = -(pgVar5->m[7].n == uVar36);
          auVar28[8] = -(pgVar5->m[8].n == uVar37);
          auVar28[9] = -(pgVar5->m[9].n == uVar38);
          auVar28[10] = -(pgVar5->m[10].n == uVar39);
          auVar28[0xb] = -(pgVar5->m[0xb].n == uVar40);
          auVar28[0xc] = -(pgVar5->m[0xc].n == uVar41);
          auVar28[0xd] = -(pgVar5->m[0xd].n == uVar42);
          auVar28[0xe] = -(pgVar5->m[0xe].n == uVar43);
          auVar28[0xf] = -(pgVar5->m[0xf].n == uVar44);
          uVar21 = (uint)(ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe);
          message = ppVar23;
          local_1a0 = ppVar23;
          local_190 = uVar20;
          if (uVar21 != 0) {
            ppVar6 = (this->activeCommandFiles).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                     .arrays.elements_;
            this = pDVar46;
            local_d8 = uVar29;
            uStack_d7 = uVar30;
            uStack_d6 = uVar31;
            uStack_d5 = uVar32;
            uStack_d4 = uVar33;
            uStack_d3 = uVar34;
            uStack_d2 = uVar35;
            uStack_d1 = uVar36;
            uStack_d0 = uVar37;
            uStack_cf = uVar38;
            uStack_ce = uVar39;
            uStack_cd = uVar40;
            uStack_cc = uVar41;
            uStack_cb = uVar42;
            uStack_ca = uVar43;
            uStack_c9 = uVar44;
            do {
              local_1e4 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> local_1e4 & 1) == 0; local_1e4 = local_1e4 + 1) {
                }
              }
              this_00 = ppVar6 + (long)ppVar23 * 0xf + (ulong)local_1e4;
              message = this_00;
              iVar19 = std::filesystem::__cxx11::path::compare((path *)path.values_);
              ppVar16 = this_00;
              if (iVar19 == 0) goto LAB_0025fa55;
              uVar21 = uVar21 - 1 & uVar21;
              uVar29 = local_d8;
              uVar30 = uStack_d7;
              uVar31 = uStack_d6;
              uVar32 = uStack_d5;
              uVar33 = uStack_d4;
              uVar34 = uStack_d3;
              uVar35 = uStack_d2;
              uVar36 = uStack_d1;
              uVar37 = uStack_d0;
              uVar38 = uStack_cf;
              uVar39 = uStack_ce;
              uVar40 = uStack_cd;
              uVar41 = uStack_cc;
              uVar42 = uStack_cb;
              uVar43 = uStack_ca;
              uVar44 = uStack_c9;
              pDVar46 = this;
            } while (uVar21 != 0);
          }
          this = pDVar46;
          ppVar16 = local_148;
          if ((pgVar15->m[0xf].n &
              (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::
                is_not_overflowed(unsigned_long)::shift)[local_198]) == 0) {
            this_00 = (path *)0x0;
            local_1e4 = 0;
            local_188 = (group_type_pointer)0x0;
            pgVar15 = local_188;
            goto LAB_0025fa55;
          }
          uVar22 = (this->activeCommandFiles).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                   .arrays.groups_size_mask;
          uVar20 = local_190 + 1;
          message = (path *)((long)&(local_1a0->_M_pathname)._M_dataplus._M_p + local_190 + 1 &
                            uVar22);
          ppVar23 = message;
          pDVar46 = this;
        } while (uVar20 <= uVar22);
        this_00 = (path *)0x0;
        local_1e4 = 0;
        local_188 = (group_type_pointer)0x0;
        pgVar15 = local_188;
LAB_0025fa55:
        local_148 = ppVar16;
        local_188 = pgVar15;
        pgVar15 = local_188;
        pDVar46 = this;
        if (this_00 != (path *)0x0) {
          uVar20 = (ulong)local_1e4;
          psVar12 = local_188->m;
          std::filesystem::__cxx11::path::~path(this_00);
          bVar3 = (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    is_not_overflowed(unsigned_long)::shift)[pgVar15->m[uVar20].n & 7];
          bVar4 = *(byte *)((ulong)(psVar12 + uVar20) | 0xf);
          pgVar15->m[uVar20].n = '\0';
          sVar11 = (this->activeCommandFiles).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                   .size_ctrl.size;
          (this->activeCommandFiles).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
          .size_ctrl.ml =
               (this->activeCommandFiles).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
               .size_ctrl.ml - (ulong)((bVar3 & bVar4) != 0);
          (this->activeCommandFiles).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
          .size_ctrl.size = sVar11 - 1;
        }
        if (bVar18 == false) {
          this->anyFailedLoads = true;
          std::filesystem::__cxx11::path::~path((path *)local_1c8);
          goto LAB_0025fcb9;
        }
        std::filesystem::__cxx11::path::~path((path *)local_1c8);
        if ((char *)local_118._0_8_ != acStack_100) {
          operator_delete((void *)local_118._0_8_);
        }
        path.values_ = (value<fmt::v11::context> *)((_List *)(path.values_ + 2) + 1);
        local_1e8 = (path *)path.values_ == local_b8;
      } while (!local_1e8);
    }
  }
  else {
    (**(code **)(*(long *)local_a0 + 0x20))(&local_178);
    local_118._16_8_ = local_178._M_pathname._M_dataplus._M_p;
    acStack_100[0] = (undefined1)local_178._M_pathname._M_string_length;
    acStack_100[1] = local_178._M_pathname._M_string_length._1_1_;
    acStack_100[2] = local_178._M_pathname._M_string_length._2_1_;
    acStack_100[3] = local_178._M_pathname._M_string_length._3_1_;
    acStack_100[4] = local_178._M_pathname._M_string_length._4_1_;
    acStack_100[5] = local_178._M_pathname._M_string_length._5_1_;
    acStack_100[6] = local_178._M_pathname._M_string_length._6_1_;
    acStack_100[7] = local_178._M_pathname._M_string_length._7_1_;
    args.field_1.values_ = aVar25.values_;
    args.desc_ = (unsigned_long_long)local_118;
    fmt.size_ = 0xdd;
    fmt.data_ = (char *)0x15;
    local_118._0_8_ = pattern_00._M_len;
    local_118._8_8_ = ppVar23;
    ::fmt::v11::vformat_abi_cxx11_((string *)local_1c8,(v11 *)"command file \'{}\': {}",fmt,args);
    message = (path *)local_1c8;
    printError(this,(string *)message);
    if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
      message = (path *)(local_1c8._16_8_ + 1);
      operator_delete((void *)local_1c8._0_8_,(size_t)message);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_pathname._M_dataplus._M_p != &local_178._M_pathname.field_2) {
      message = (path *)(local_178._M_pathname.field_2._M_allocated_capacity + 1);
      operator_delete(local_178._M_pathname._M_dataplus._M_p,(size_t)message);
    }
    this->anyFailedLoads = true;
    local_1e8 = false;
  }
  SmallVectorBase<std::filesystem::__cxx11::path>::cleanup
            ((SmallVectorBase<std::filesystem::__cxx11::path> *)&local_98,(EVP_PKEY_CTX *)message);
  return local_1e8;
}

Assistant:

bool Driver::processCommandFiles(std::string_view pattern, bool makeRelative, bool separateUnit) {
    auto onError = [this](const auto& name, std::error_code ec) {
        printError(fmt::format("command file '{}': {}", name, ec.message()));
        anyFailedLoads = true;
        return false;
    };

    SmallVector<fs::path> files;
    std::error_code globEc;
    svGlob({}, pattern, GlobMode::Files, files, /* expandEnvVars */ false, globEc);
    if (globEc)
        return onError(pattern, globEc);

    for (auto& path : files) {
        SmallVector<char> buffer;
        if (auto readEc = OS::readFile(path, buffer))
            return onError(getU8Str(path), readEc);

        if (!activeCommandFiles.insert(path).second) {
            printError(
                fmt::format("command file '{}' includes itself recursively", getU8Str(path)));
            anyFailedLoads = true;
            return false;
        }

        fs::path currPath;
        std::error_code ec;
        if (makeRelative) {
            currPath = fs::current_path(ec);
            fs::current_path(path.parent_path(), ec);
        }

        SLANG_ASSERT(!buffer.empty());
        buffer.pop_back();
        std::string_view argStr(buffer.data(), buffer.size());

        bool result;
        if (separateUnit) {
            result = parseUnitListing(argStr);
        }
        else {
            CommandLine::ParseOptions parseOpts;
            parseOpts.expandEnvVars = true;
            parseOpts.ignoreProgramName = true;
            parseOpts.supportComments = true;
            parseOpts.ignoreDuplicates = true;
            result = parseCommandLine(argStr, parseOpts);
        }

        if (makeRelative)
            fs::current_path(currPath, ec);

        activeCommandFiles.erase(path);

        if (!result) {
            anyFailedLoads = true;
            return false;
        }
    }

    return true;
}